

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MapFieldBase::DeleteMapValue(MapFieldBase *this,MapKey *map_key)

{
  UntypedMapBase *pUVar1;
  size_type sVar2;
  MapKey *map_key_local;
  MapFieldBase *this_local;
  
  pUVar1 = MapFieldBaseForParse::MutableMap(&this->super_MapFieldBaseForParse);
  sVar2 = VisitMapKey<google::protobuf::internal::UntypedMapBase,google::protobuf::internal::MapFieldBase::DeleteMapValue(google::protobuf::MapKey_const&)::__0>
                    (map_key,pUVar1);
  return sVar2 != 0;
}

Assistant:

bool MapFieldBase::DeleteMapValue(const MapKey& map_key) {
  return VisitMapKey(map_key, *MutableMap(), [](auto& map, const auto& key) {
    return map.EraseImpl(key);
  });
}